

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O1

bool __thiscall DIS::EnvironmentType::operator==(EnvironmentType *this,EnvironmentType *rhs)

{
  return ((this->_entityClass == rhs->_entityClass && this->_domain == rhs->_domain) &&
         this->_entityKind == rhs->_entityKind) &&
         (((this->_extra == rhs->_extra && rhs->_specific == this->_specific) &&
          rhs->_subcategory == this->_subcategory) && rhs->_category == this->_category);
}

Assistant:

bool EnvironmentType::operator ==(const EnvironmentType& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_entityKind == rhs._entityKind) ) ivarsEqual = false;
     if( ! (_domain == rhs._domain) ) ivarsEqual = false;
     if( ! (_entityClass == rhs._entityClass) ) ivarsEqual = false;
     if( ! (_category == rhs._category) ) ivarsEqual = false;
     if( ! (_subcategory == rhs._subcategory) ) ivarsEqual = false;
     if( ! (_specific == rhs._specific) ) ivarsEqual = false;
     if( ! (_extra == rhs._extra) ) ivarsEqual = false;

    return ivarsEqual;
 }